

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  int iVar1;
  undefined4 extraout_var;
  long in_RDX;
  MessageLite *in_RSI;
  long in_RDI;
  MessageLite *ret;
  MessageLite *in_stack_ffffffffffffff38;
  Arena *in_stack_ffffffffffffff40;
  MessageLite *local_8;
  
  if ((in_RDI == 0) || (in_RDX != 0)) {
    iVar1 = (*in_RSI->_vptr_MessageLite[4])(in_RSI,in_RDI);
    local_8 = (MessageLite *)CONCAT44(extraout_var,iVar1);
    (*local_8->_vptr_MessageLite[10])(local_8,in_RSI);
  }
  else {
    Arena::Own<google::protobuf::MessageLite>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  GOOGLE_DCHECK(submessage->GetArena() == submessage_arena);
  GOOGLE_DCHECK(message_arena != submessage_arena);
  if (message_arena != NULL && submessage_arena == NULL) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}